

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QModelIndex>::reallocate
          (QMovableArrayOps<QModelIndex> *this,qsizetype alloc,AllocationOption option)

{
  pair<QTypedArrayData<QModelIndex>_*,_QModelIndex_*> pVar1;
  
  pVar1 = QTypedArrayData<QModelIndex>::reallocateUnaligned
                    ((this->super_QGenericArrayOps<QModelIndex>).
                     super_QArrayDataPointer<QModelIndex>.d,
                     (this->super_QGenericArrayOps<QModelIndex>).
                     super_QArrayDataPointer<QModelIndex>.ptr,alloc,option);
  (this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.d = pVar1.first;
  (this->super_QGenericArrayOps<QModelIndex>).super_QArrayDataPointer<QModelIndex>.ptr =
       pVar1.second;
  return;
}

Assistant:

void reallocate(qsizetype alloc, QArrayData::AllocationOption option)
    {
        auto pair = Data::reallocateUnaligned(this->d, this->ptr, alloc, option);
        Q_CHECK_PTR(pair.second);
        Q_ASSERT(pair.first != nullptr);
        this->d = pair.first;
        this->ptr = pair.second;
    }